

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O0

void __thiscall tf::Executor::_join_dynamic_task_internal(Executor *this,Worker *w,Node *p,Graph *g)

{
  SmallVectorStorage<tf::Node_*,_2U> this_00;
  bool bVar1;
  __int_type_conflict _Var2;
  reference ppNVar3;
  atomic<int> *paVar4;
  size_t sVar5;
  size_type sVar6;
  Node *local_b0;
  Node *n;
  iterator __end1;
  iterator __begin1;
  vector<tf::Node_*,_std::allocator<tf::Node_*>_> *__range1;
  SmallVector<tf::Node_*,_2U> src;
  Graph *g_local;
  Node *p_local;
  Worker *w_local;
  Executor *this_local;
  memory_order __b;
  
  src.Storage.InlineElts[0] = (U  [1])(U  [1])g;
  bVar1 = Graph::empty(g);
  if ((!bVar1) ||
     (_Var2 = std::__atomic_base::operator_cast_to_unsigned_long((__atomic_base *)&p->_join_counter)
     , _Var2 != 0)) {
    SmallVector<tf::Node_*,_2U>::SmallVector((SmallVector<tf::Node_*,_2U> *)&__range1);
    this_00 = src.Storage;
    __end1 = std::vector<tf::Node_*,_std::allocator<tf::Node_*>_>::begin
                       ((vector<tf::Node_*,_std::allocator<tf::Node_*>_> *)src.Storage.InlineElts[0]
                       );
    n = (Node *)std::vector<tf::Node_*,_std::allocator<tf::Node_*>_>::end
                          ((vector<tf::Node_*,_std::allocator<tf::Node_*>_> *)this_00.InlineElts[0])
    ;
    while (bVar1 = __gnu_cxx::
                   operator==<tf::Node_**,_std::vector<tf::Node_*,_std::allocator<tf::Node_*>_>_>
                             (&__end1,(__normal_iterator<tf::Node_**,_std::vector<tf::Node_*,_std::allocator<tf::Node_*>_>_>
                                       *)&n), ((bVar1 ^ 0xffU) & 1) != 0) {
      ppNVar3 = __gnu_cxx::
                __normal_iterator<tf::Node_**,_std::vector<tf::Node_*,_std::allocator<tf::Node_*>_>_>
                ::operator*(&__end1);
      local_b0 = *ppNVar3;
      local_b0->_topology = p->_topology;
      paVar4 = &local_b0->_state;
      std::operator&(relaxed,__memory_order_mask);
      (paVar4->super___atomic_base<int>)._M_i = 0;
      Node::_set_up_join_counter(local_b0);
      local_b0->_parent = p;
      sVar5 = Node::num_dependents(local_b0);
      if (sVar5 == 0) {
        SmallVectorTemplateBase<tf::Node_*,_true>::push_back
                  ((SmallVectorTemplateBase<tf::Node_*,_true> *)&__range1,&local_b0);
      }
      __gnu_cxx::
      __normal_iterator<tf::Node_**,_std::vector<tf::Node_*,_std::allocator<tf::Node_*>_>_>::
      operator++(&__end1);
    }
    sVar6 = SmallVectorTemplateCommon<tf::Node_*,_void>::size
                      ((SmallVectorTemplateCommon<tf::Node_*,_void> *)&__range1);
    LOCK();
    (p->_join_counter).super___atomic_base<unsigned_long>._M_i =
         (p->_join_counter).super___atomic_base<unsigned_long>._M_i + sVar6;
    UNLOCK();
    _schedule(this,w,(SmallVector<tf::Node_*,_2U> *)&__range1);
    _consume_task(this,w,p);
    SmallVector<tf::Node_*,_2U>::~SmallVector((SmallVector<tf::Node_*,_2U> *)&__range1);
  }
  return;
}

Assistant:

inline void Executor::_join_dynamic_task_internal(
  Worker& w, Node* p, Graph& g
) {

  // graph is empty and has no async tasks
  if(g.empty() && p->_join_counter == 0) {
    return;
  }

  SmallVector<Node*> src;

  for(auto n : g._nodes) {
    n->_topology = p->_topology;
    n->_state.store(0, std::memory_order_relaxed);
    n->_set_up_join_counter();
    n->_parent = p;
    if(n->num_dependents() == 0) {
      src.push_back(n);
    }
  }
  p->_join_counter.fetch_add(src.size());
  _schedule(w, src);
  _consume_task(w, p);
}